

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPTP.hpp
# Opt level: O0

char __thiscall Parse::TPTP::getChar(TPTP *this,int pos)

{
  char *pcVar1;
  int in_ESI;
  long in_RDI;
  int c;
  size_t in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  while (*(int *)(in_RDI + 0xa8) <= in_ESI) {
    in_stack_ffffffffffffffe4 = std::istream::get();
    if (in_stack_ffffffffffffffe4 == -1) {
      in_stack_ffffffffffffffe4 = 0;
    }
    in_stack_ffffffffffffffe0 =
         CONCAT13((char)in_stack_ffffffffffffffe4,(int3)in_stack_ffffffffffffffe0);
    *(int *)(in_RDI + 0xa8) = *(int *)(in_RDI + 0xa8) + 1;
    pcVar1 = Lib::Array<char>::operator[]
                       ((Array<char> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                        ,in_stack_ffffffffffffffd8);
    *pcVar1 = (char)((uint)in_stack_ffffffffffffffe0 >> 0x18);
  }
  pcVar1 = Lib::Array<char>::operator[]
                     ((Array<char> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
  return *pcVar1;
}

Assistant:

inline char getChar(int pos)
  {
    while (_cend <= pos) {
      int c = currentFile.in->get();
      //      if (c == -1) { std::cout << "<EOF>"; } else {std::cout << char(c);}
      _chars[_cend++] = c == -1 ? 0 : c;
    }
    return _chars[pos];
  }